

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_sys.c
# Opt level: O2

c_int unload_linsys_solver(linsys_solver_type linsys_solver)

{
  c_int cVar1;
  
  if (linsys_solver == MKL_PARDISO_SOLVER) {
    cVar1 = lh_unload_pardiso();
    return cVar1;
  }
  return 0;
}

Assistant:

c_int unload_linsys_solver(enum linsys_solver_type linsys_solver) {
  switch (linsys_solver) {
  case QDLDL_SOLVER:

    // We do not load QDLDL solver. We have the source.
    return 0;

# ifdef ENABLE_MKL_PARDISO
  case MKL_PARDISO_SOLVER:

    // Unload Pardiso library
    return lh_unload_pardiso();

# endif /* ifdef ENABLE_MKL_PARDISO */
  default: //  QDLDL
    return 0;
  }
}